

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.hpp
# Opt level: O0

void __thiscall
tf::Topology::
Topology<multiple_subflow_runs_with_predicate(unsigned_int)::__8,multiple_subflow_runs_with_predicate(unsigned_int)::__9>
          (Topology *this,Taskflow *tf,anon_class_4_1_ba1d75eb *p,anon_class_8_1_a7c1402f *c)

{
  atomic<unsigned_long> *in_RCX;
  anon_class_8_1_a7c1402f *in_RDX;
  function<bool_()> *in_RSI;
  undefined8 *in_RDI;
  promise<void> *unaff_retaddr;
  
  *in_RDI = in_RSI;
  std::promise<void>::promise(unaff_retaddr);
  std::function<bool()>::function<multiple_subflow_runs_with_predicate(unsigned_int)::__8,void>
            (in_RSI,(anon_class_4_1_ba1d75eb *)in_RDX);
  std::function<void()>::function<multiple_subflow_runs_with_predicate(unsigned_int)::__9,void>
            ((function<void_()> *)in_RSI,in_RDX);
  std::atomic<unsigned_long>::atomic(in_RCX,(__integral_type_conflict)in_RDI);
  std::atomic<int>::atomic((atomic<int> *)in_RCX,(__integral_type)((ulong)in_RDI >> 0x20));
  std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)(in_RDI + 0xe),(nullptr_t)0x0)
  ;
  return;
}

Assistant:

Topology::Topology(Taskflow& tf, P&& p, C&& c):
  _taskflow(tf),
  _pred {std::forward<P>(p)},
  _call {std::forward<C>(c)} {
}